

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

ZSTD_CDict *
duckdb_zstd::ZSTD_createCDict_advanced
          (void *dictBuffer,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
          ZSTD_dictContentType_e dictContentType,ZSTD_compressionParameters cParams,
          ZSTD_customMem customMem)

{
  ZSTD_CDict *pZVar1;
  ZSTD_CCtx_params cctxParams;
  ZSTD_CCtx_params *in_stack_00000230;
  ZSTD_dictContentType_e in_stack_00000238;
  ZSTD_dictLoadMethod_e in_stack_0000023c;
  size_t in_stack_00000240;
  void *in_stack_00000248;
  ZSTD_customMem in_stack_00000260;
  ZSTD_CCtx_params *in_stack_fffffffffffffec8;
  undefined1 local_f0 [240];
  
  memset(local_f0,0,0xd8);
  ZSTD_CCtxParams_init(in_stack_fffffffffffffec8,0);
  pZVar1 = ZSTD_createCDict_advanced2
                     (in_stack_00000248,in_stack_00000240,in_stack_0000023c,in_stack_00000238,
                      in_stack_00000230,in_stack_00000260);
  return pZVar1;
}

Assistant:

ZSTD_CDict* ZSTD_createCDict_advanced(const void* dictBuffer, size_t dictSize,
                                      ZSTD_dictLoadMethod_e dictLoadMethod,
                                      ZSTD_dictContentType_e dictContentType,
                                      ZSTD_compressionParameters cParams,
                                      ZSTD_customMem customMem)
{
    ZSTD_CCtx_params cctxParams;
    ZSTD_memset(&cctxParams, 0, sizeof(cctxParams));
    ZSTD_CCtxParams_init(&cctxParams, 0);
    cctxParams.cParams = cParams;
    cctxParams.customMem = customMem;
    return ZSTD_createCDict_advanced2(
        dictBuffer, dictSize,
        dictLoadMethod, dictContentType,
        &cctxParams, customMem);
}